

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 gauden_dist_norm(gauden_t *g,int32 n_top,gauden_dist_t ***dist,uint8 *active)

{
  int local_44;
  int local_40;
  int32 scale;
  int32 sum;
  int32 t;
  int32 f;
  int32 gid;
  uint8 *active_local;
  gauden_dist_t ***dist_local;
  int32 n_top_local;
  gauden_t *g_local;
  
  if (g->n_mgau < 2) {
    local_44 = 0;
    for (sum = 0; sum < g->n_feat; sum = sum + 1) {
      local_40 = (*dist)[sum]->dist;
      for (scale = 1; scale < n_top; scale = scale + 1) {
        local_40 = logmath_add(g->logmath,local_40,(*dist)[sum][scale].dist);
      }
      for (scale = 0; scale < n_top; scale = scale + 1) {
        (*dist)[sum][scale].dist = (*dist)[sum][scale].dist - local_40;
      }
      local_44 = local_40 + local_44;
    }
    g_local._4_4_ = local_44;
  }
  else {
    g_local._4_4_ = gauden_dist_norm_global(g,n_top,dist,active);
  }
  return g_local._4_4_;
}

Assistant:

int32
gauden_dist_norm(gauden_t * g, int32 n_top, gauden_dist_t *** dist,
                 uint8 * active)
{
    int32 gid, f, t;
    int32 sum, scale;

    if (g->n_mgau > 1) {
        /* Normalize by subtracting max(density values) from each density */
        return (gauden_dist_norm_global(g, n_top, dist, active));
    }

    /* Normalize by subtracting log(sum of density values) from each density */
    gid = 0;
    scale = 0;
    for (f = 0; f < g->n_feat; f++) {
        sum = dist[gid][f][0].dist;
        for (t = 1; t < n_top; t++)
            sum = logmath_add(g->logmath, sum, dist[gid][f][t].dist);

        for (t = 0; t < n_top; t++)
            dist[gid][f][t].dist -= sum;

        scale += sum;
    }

    return scale;               /* Scale factor applied to EVERY senone score */
}